

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

object * __thiscall
test_parser::deserialize_bytes
          (object *__return_storage_ptr__,test_parser *this,bytes_view_type in_data,
          text_encoding in_write_encoding)

{
  basic_string_view<char,_std::char_traits<char>_> in_mbstring;
  __sv_type __args;
  pair<bool,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  local_128;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_100;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_f0;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_d0;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_c0;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> local_a0;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_90;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_60;
  undefined1 local_50 [8];
  u8string u8_string;
  text_encoding in_write_encoding_local;
  test_parser *this_local;
  bytes_view_type in_data_local;
  
  in_data_local._M_len = (size_t)in_data._M_str;
  this_local = (test_parser *)in_data._M_len;
  u8_string.field_2._12_4_ = in_write_encoding;
  in_data_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::u8string::u8string((u8string *)local_50);
  switch(u8_string.field_2._12_4_) {
  case 0:
    local_60 = jessilib::
               string_view_cast<char8_t,std::basic_string_view<char,std::char_traits<char>>>
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    std::__cxx11::u8string::operator=((u8string *)local_50,&local_60);
    break;
  case 1:
    local_a0 = jessilib::
               string_view_cast<char16_t,std::basic_string_view<char,std::char_traits<char>>>
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    jessilib::string_cast<char8_t,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
              (&local_90,(jessilib *)&local_a0,
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)local_a0._M_str);
    std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
    operator=((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_50
              ,&local_90);
    std::__cxx11::u8string::~u8string((u8string *)&local_90);
    break;
  default:
    break;
  case 3:
    local_d0 = jessilib::
               string_view_cast<char32_t,std::basic_string_view<char,std::char_traits<char>>>
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    jessilib::string_cast<char8_t,std::basic_string_view<char32_t,std::char_traits<char32_t>>>
              (&local_c0,(jessilib *)&local_d0,
               (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)local_d0._M_str);
    std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
    operator=((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_50
              ,&local_c0);
    std::__cxx11::u8string::~u8string((u8string *)&local_c0);
    break;
  case 5:
    local_100 = jessilib::
                string_view_cast<wchar_t,std::basic_string_view<char,std::char_traits<char>>>
                          ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    jessilib::string_cast<char8_t,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
              (&local_f0,(jessilib *)&local_100,
               (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_100._M_str);
    std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
    operator=((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_50
              ,&local_f0);
    std::__cxx11::u8string::~u8string((u8string *)&local_f0);
    break;
  case 6:
    in_mbstring = jessilib::
                  string_view_cast<char,std::basic_string_view<char,std::char_traits<char>>>
                            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    jessilib::mbstring_to_ustring<char8_t>(&local_128,in_mbstring);
    std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
    operator=((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_50
              ,&local_128.second);
    std::
    pair<bool,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
    ::~pair(&local_128);
  }
  __args = std::__cxx11::u8string::operator_cast_to_basic_string_view((u8string *)local_50);
  std::function<jessilib::object_(std::basic_string_view<char8_t,_std::char_traits<char8_t>_>)>::
  operator()(__return_storage_ptr__,&deserialize_impl,__args);
  std::__cxx11::u8string::~u8string((u8string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

object deserialize_bytes(bytes_view_type in_data, text_encoding in_write_encoding) override {
		std::u8string u8_string;

		switch (in_write_encoding) {
			case text_encoding::utf_8:
				u8_string = string_view_cast<char8_t>(in_data);
				break;
			case text_encoding::utf_16:
				u8_string = jessilib::string_cast<char8_t>(string_view_cast<char16_t>(in_data));
				break;
			case text_encoding::utf_32:
				u8_string = jessilib::string_cast<char8_t>(string_view_cast<char32_t>(in_data));
				break;
			case text_encoding::wchar:
				u8_string = jessilib::string_cast<char8_t>(string_view_cast<wchar_t>(in_data));
				break;
			case text_encoding::multibyte:
				u8_string = mbstring_to_ustring<char8_t>(string_view_cast<char>(in_data)).second;
				break;
			default:
				break;
		}

		return deserialize_impl(std::u8string_view{ u8_string });
	}